

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O3

int __thiscall deci::ast_postfix_t::Generate(ast_postfix_t *this,ostream *output,int pc)

{
  ast_arg_list_t *paVar1;
  pointer ppaVar2;
  ostream *poVar3;
  int iVar4;
  pointer ppaVar5;
  
  paVar1 = this->arglist;
  if (paVar1 == (ast_arg_list_t *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(output,"call ",5);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (output,(this->identifier)._M_dataplus._M_p,
                        (this->identifier)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\nresl",5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    iVar4 = pc + 2;
  }
  else {
    ppaVar2 = (paVar1->args).
              super__Vector_base<deci::ast_item_t_*,_std::allocator<deci::ast_item_t_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppaVar5 = (paVar1->args).
                   super__Vector_base<deci::ast_item_t_*,_std::allocator<deci::ast_item_t_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppaVar5 != ppaVar2;
        ppaVar5 = ppaVar5 + 1) {
      pc = (*(*ppaVar5)->_vptr_ast_item_t[2])(*ppaVar5,output,(ulong)(uint)pc);
    }
    std::__ostream_insert<char,std::char_traits<char>>(output,"call ",5);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (output,(this->identifier)._M_dataplus._M_p,
                        (this->identifier)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\ndrop ",6);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\nresl",5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    iVar4 = pc + 3;
  }
  return iVar4;
}

Assistant:

int ast_postfix_t::Generate(std::ostream& output, int pc) const {
    if (arglist == nullptr) {
      output << "call " << this->identifier << "\nresl" << std::endl;
      return pc + 2;
    }
    else
    {
      pc = arglist->Generate(output, pc);
      output << "call " << this->identifier << "\ndrop " << arglist->Total() << "\nresl" << std::endl;
      return pc + 3;
    }
  }